

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Float pbrt::ErfInv(Float a)

{
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar1;
  uint uVar2;
  float *pfVar3;
  int __x;
  float *__a;
  float in_XMM0_Da;
  float b;
  float c;
  float fVar4;
  double dVar5;
  float t;
  float p;
  char (*in_stack_00000030) [28];
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  LogLevel in_stack_00000054;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  float a_00;
  float local_8;
  
  b = FMA(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  c = std::numeric_limits<float>::min();
  __a = (float *)&stack0xfffffffffffffff0;
  pfVar3 = std::max<float>(__a,(float *)&stack0xffffffffffffffec);
  __x = (int)__a;
  dVar5 = std::log((double)(ulong)(uint)*pfVar3);
  fVar4 = SUB84(dVar5,0);
  eVar1 = IsNaN<float>(0.0);
  if (!eVar1) {
    uVar2 = std::isinf((double)(ulong)(uint)fVar4);
    if ((uVar2 & 1) == 0) {
      a_00 = fVar4;
      std::abs(__x);
      if (fVar4 <= 6.125) {
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        local_8 = FMA(a_00,b,c);
      }
      else {
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        FMA(a_00,b,c);
        local_8 = FMA(a_00,b,c);
      }
      return in_XMM0_Da * local_8;
    }
  }
  LogFatal<char_const(&)[28]>
            (in_stack_00000054,in_stack_00000048,in_stack_00000044,in_stack_00000038,
             in_stack_00000030);
}

Assistant:

PBRT_CPU_GPU
inline Float ErfInv(Float a) {
#ifdef PBRT_IS_GPU_CODE
    return erfinv(a);
#else
    // https://stackoverflow.com/a/49743348
    float p;
    float t = std::log(std::max(FMA(a, -a, 1), std::numeric_limits<Float>::min()));
    CHECK(!IsNaN(t) && !std::isinf(t));
    if (std::abs(t) > 6.125f) {          // maximum ulp error = 2.35793
        p = 3.03697567e-10f;             //  0x1.4deb44p-32
        p = FMA(p, t, 2.93243101e-8f);   //  0x1.f7c9aep-26
        p = FMA(p, t, 1.22150334e-6f);   //  0x1.47e512p-20
        p = FMA(p, t, 2.84108955e-5f);   //  0x1.dca7dep-16
        p = FMA(p, t, 3.93552968e-4f);   //  0x1.9cab92p-12
        p = FMA(p, t, 3.02698812e-3f);   //  0x1.8cc0dep-9
        p = FMA(p, t, 4.83185798e-3f);   //  0x1.3ca920p-8
        p = FMA(p, t, -2.64646143e-1f);  // -0x1.0eff66p-2
        p = FMA(p, t, 8.40016484e-1f);   //  0x1.ae16a4p-1
    } else {                             // maximum ulp error = 2.35456
        p = 5.43877832e-9f;              //  0x1.75c000p-28
        p = FMA(p, t, 1.43286059e-7f);   //  0x1.33b458p-23
        p = FMA(p, t, 1.22775396e-6f);   //  0x1.49929cp-20
        p = FMA(p, t, 1.12962631e-7f);   //  0x1.e52bbap-24
        p = FMA(p, t, -5.61531961e-5f);  // -0x1.d70c12p-15
        p = FMA(p, t, -1.47697705e-4f);  // -0x1.35be9ap-13
        p = FMA(p, t, 2.31468701e-3f);   //  0x1.2f6402p-9
        p = FMA(p, t, 1.15392562e-2f);   //  0x1.7a1e4cp-7
        p = FMA(p, t, -2.32015476e-1f);  // -0x1.db2aeep-3
        p = FMA(p, t, 8.86226892e-1f);   //  0x1.c5bf88p-1
    }
    return a * p;
#endif  // PBRT_IS_GPU_CODE
}